

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevolute.cpp
# Opt level: O2

void __thiscall chrono::ChLinkRevolute::ConstraintsFetch_react(ChLinkRevolute *this,double factor)

{
  ChMatrix33<double> *pCVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  ChVector<double> v;
  ChVector<double> u1;
  ChVector<double> T2;
  ChMatrix33<double> mat2;
  ChVector<double> v1;
  ChVector<double> F2;
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_120;
  ChVector<double> local_118;
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_f8;
  double dStack_f0;
  double local_e8;
  ChVector<double> local_e0;
  ChVector<double> local_c8 [3];
  double local_78;
  double dStack_70;
  double local_68;
  ChVector<double> local_60;
  ChVector<double> local_48;
  
  dVar2 = (this->m_cnstr_vw).super_ChConstraintTwo.super_ChConstraint.l_i;
  local_48.m_data[0] = factor * (this->m_cnstr_x).super_ChConstraintTwo.super_ChConstraint.l_i;
  local_48.m_data[1] = factor * (this->m_cnstr_y).super_ChConstraintTwo.super_ChConstraint.l_i;
  dVar3 = (this->m_cnstr_uw).super_ChConstraintTwo.super_ChConstraint.l_i;
  local_48.m_data[2] = factor * (this->m_cnstr_z).super_ChConstraintTwo.super_ChConstraint.l_i;
  local_c8[0].m_data[0] =
       (double)&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                Amatrix;
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_c8,&local_48);
  pCVar1 = &(this->m_frame2).Amatrix;
  local_f8.m_matrix = &pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>;
  chrono::operator*(&local_f8,&local_60);
  if (local_c8 != &(this->super_ChLink).react_force) {
    (this->super_ChLink).react_force.m_data[0] = local_c8[0].m_data[0];
    (this->super_ChLink).react_force.m_data[1] = local_c8[0].m_data[1];
    (this->super_ChLink).react_force.m_data[2] = local_c8[0].m_data[2];
  }
  dVar2 = factor * dVar2;
  dVar3 = factor * dVar3;
  local_c8[0].m_data[0] =
       (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_c8[0].m_data[1] =
       *(double *)
        ((long)(this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x18);
  local_c8[0].m_data[2] =
       *(double *)
        ((long)(this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x30);
  ChMatrix33<double>::operator*
            (&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
              Amatrix,local_c8);
  local_c8[0].m_data[0] =
       *(double *)
        ((long)(this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        8);
  local_c8[0].m_data[1] =
       *(double *)
        ((long)(this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x20);
  local_c8[0].m_data[2] =
       *(double *)
        ((long)(this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x38);
  ChMatrix33<double>::operator*
            (&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
              Amatrix,local_c8);
  local_e0.m_data[1] = (double)&this->m_w2_tilde;
  local_e0.m_data[0] =
       (double)&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                Amatrix;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)local_c8,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_e0);
  local_118.m_data[2] = dVar3 * local_e8 + dVar2 * local_68;
  local_118.m_data[0] = dVar3 * (double)local_f8.m_matrix + dVar2 * local_78;
  local_118.m_data[1] = dVar3 * dStack_f0 + dVar2 * dStack_70;
  local_120.m_matrix = (non_const_type)local_c8;
  chrono::operator*(&local_120,&local_118);
  local_120.m_matrix = &pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>;
  chrono::operator*(&local_120,&local_e0);
  auVar4._0_8_ = -local_118.m_data[2];
  auVar4._8_4_ = 0;
  auVar4._12_4_ = 0x80000000;
  *(undefined4 *)(this->super_ChLink).react_torque.m_data = local_118.m_data[0]._0_4_;
  *(uint *)((long)(this->super_ChLink).react_torque.m_data + 4) =
       local_118.m_data[0]._4_4_ ^ 0x80000000;
  *(undefined4 *)((this->super_ChLink).react_torque.m_data + 1) = local_118.m_data[1]._0_4_;
  *(uint *)((long)(this->super_ChLink).react_torque.m_data + 0xc) =
       local_118.m_data[1]._4_4_ ^ 0x80000000;
  dVar2 = (double)vmovlps_avx(auVar4);
  (this->super_ChLink).react_torque.m_data[2] = dVar2;
  return;
}

Assistant:

void ChLinkRevolute::ConstraintsFetch_react(double factor) {
    // Extract the Lagrange multipliers for the 3 spherical constraints and for
    // the 2 dot constraint.
    ChVector<> lam_sph(m_cnstr_x.Get_l_i(), m_cnstr_y.Get_l_i(), m_cnstr_z.Get_l_i());
    double lam_uw = m_cnstr_uw.Get_l_i();
    double lam_vw = m_cnstr_vw.Get_l_i();

    // Note that the Lagrange multipliers must be multiplied by 'factor' to
    // convert from reaction impulses to reaction forces.
    lam_sph *= factor;
    lam_uw *= factor;
    lam_vw *= factor;

    // Calculate the reaction force and torque acting on the 2nd body at the joint
    // location, expressed in the joint reference frame.  Taking into account the
    // sign with which Lagrange multipliers show up in the EOM in Chrono, we get:
    //   F = C^T * A_2^T * Phi_r2^T * lam
    //   T = C^T * ( Phi_pi2^T - tilde(s2') * A_2^T * Phi_r2^T ) * lam
    // For the revolute joint, after some manipulations, we have:
    //   F = C^T * A_2^T * lam_sph
    //   T = C^T * tilde(w2') *A_2^T * (u1 * lam_uw + v1 * lam_vw)
    //     = -C^T * [A_2 * tilde(w2')]^T * (u1 * lam_uw + v1 * lam_vw)

    // Reaction force
    ChVector<> F2 = Body2->GetA().transpose() * lam_sph;
    react_force = m_frame2.GetA().transpose() * F2;

    // Reaction torque
    ChVector<> u1 = Body1->TransformDirectionLocalToParent(m_frame1.GetA().Get_A_Xaxis());
    ChVector<> v1 = Body1->TransformDirectionLocalToParent(m_frame1.GetA().Get_A_Yaxis());
    ChMatrix33<> mat2 = Body2->GetA() * m_w2_tilde;
    ChVector<> T2 = mat2.transpose() * (lam_uw * u1 + lam_vw * v1);
    react_torque = -(m_frame2.GetA().transpose() * T2);
}